

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O3

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  long lVar1;
  pointer pCVar2;
  CBlockIndex *pCVar3;
  uint256 *puVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  Logger *pLVar12;
  int i;
  long lVar13;
  CBlockHeader *hdr;
  pointer pCVar14;
  long in_FS_OFFSET;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  char *fmt;
  long *in_stack_ffffffffffffffa8;
  uchar in_stack_ffffffffffffffb0;
  uchar in_stack_ffffffffffffffb1;
  uchar in_stack_ffffffffffffffb2;
  uchar in_stack_ffffffffffffffb3;
  uchar in_stack_ffffffffffffffb4;
  uchar in_stack_ffffffffffffffb5;
  uchar in_stack_ffffffffffffffb6;
  uchar in_stack_ffffffffffffffb7;
  uchar in_stack_ffffffffffffffb8;
  uchar in_stack_ffffffffffffffb9;
  uchar in_stack_ffffffffffffffba;
  uchar in_stack_ffffffffffffffbb;
  uchar in_stack_ffffffffffffffbc;
  uchar in_stack_ffffffffffffffbd;
  uchar in_stack_ffffffffffffffbe;
  uchar in_stack_ffffffffffffffbf;
  uchar local_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  uchar uStack_38;
  uchar uStack_37;
  uchar uStack_36;
  uchar uStack_35;
  uchar uStack_34;
  uchar uStack_33;
  uchar uStack_32;
  uchar uStack_31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar14 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar9 = true;
  if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish == pCVar14) goto LAB_00468aec;
  if (this->m_download_state == PRESYNC) {
    CBlockHeader::GetHash((uint256 *)&stack0xffffffffffffffb0,&this->m_last_header_received);
    auVar16[0] = -(in_stack_ffffffffffffffb0 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0]);
    auVar16[1] = -(in_stack_ffffffffffffffb1 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[1]);
    auVar16[2] = -(in_stack_ffffffffffffffb2 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[2]);
    auVar16[3] = -(in_stack_ffffffffffffffb3 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[3]);
    auVar16[4] = -(in_stack_ffffffffffffffb4 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[4]);
    auVar16[5] = -(in_stack_ffffffffffffffb5 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[5]);
    auVar16[6] = -(in_stack_ffffffffffffffb6 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[6]);
    auVar16[7] = -(in_stack_ffffffffffffffb7 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[7]);
    auVar16[8] = -(in_stack_ffffffffffffffb8 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[8]);
    auVar16[9] = -(in_stack_ffffffffffffffb9 ==
                  (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[9]);
    auVar16[10] = -(in_stack_ffffffffffffffba ==
                   (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[10]);
    auVar16[0xb] = -(in_stack_ffffffffffffffbb ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xb]);
    auVar16[0xc] = -(in_stack_ffffffffffffffbc ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xc]);
    auVar16[0xd] = -(in_stack_ffffffffffffffbd ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xd]);
    auVar16[0xe] = -(in_stack_ffffffffffffffbe ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xe]);
    auVar16[0xf] = -(in_stack_ffffffffffffffbf ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0xf]);
    auVar15[0] = -(local_40 == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x10])
    ;
    auVar15[1] = -(uStack_3f == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x11]
                  );
    auVar15[2] = -(uStack_3e == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x12]
                  );
    auVar15[3] = -(uStack_3d == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x13]
                  );
    auVar15[4] = -(uStack_3c == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x14]
                  );
    auVar15[5] = -(uStack_3b == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x15]
                  );
    auVar15[6] = -(uStack_3a == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x16]
                  );
    auVar15[7] = -(uStack_39 == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x17]
                  );
    auVar15[8] = -(uStack_38 == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x18]
                  );
    auVar15[9] = -(uStack_37 == (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x19]
                  );
    auVar15[10] = -(uStack_36 ==
                   (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1a]);
    auVar15[0xb] = -(uStack_35 ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1b]);
    auVar15[0xc] = -(uStack_34 ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1c]);
    auVar15[0xd] = -(uStack_33 ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1d]);
    auVar15[0xe] = -(uStack_32 ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1e]);
    auVar15[0xf] = -(uStack_31 ==
                    (pCVar14->hashPrevBlock).super_base_blob<256U>.m_data._M_elems[0x1f]);
    auVar15 = auVar15 & auVar16;
    iVar8 = (int)this;
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff) {
      pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar14 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>).
                     _M_impl.super__Vector_impl_data._M_start; pCVar14 != pCVar2;
          pCVar14 = pCVar14 + 1) {
        bVar10 = ValidateAndProcessSingleHeader(this,pCVar14);
        if (!bVar10) goto LAB_00468aea;
      }
      iVar11 = base_uint<256U>::CompareTo
                         (&(this->m_current_chain_work).super_base_uint<256U>,
                          &(this->m_minimum_required_work).super_base_uint<256U>);
      if (-1 < iVar11) {
        std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                  (&this->m_redownloaded_headers);
        pCVar3 = this->m_chain_start;
        this->m_redownload_buffer_last_height = (long)pCVar3->nHeight;
        puVar4 = pCVar3->phashBlock;
        if (puVar4 != (uint256 *)0x0) {
          uVar5 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
          uVar7 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = uVar7;
          *(undefined8 *)
           (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems = uVar5
          ;
          *(undefined8 *)
           ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems + 8) =
               uVar6;
          puVar4 = pCVar3->phashBlock;
          if (puVar4 != (uint256 *)0x0) {
            uVar5 = *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
            uVar6 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
            uVar7 = *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
                 *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
                 uVar7;
            *(undefined8 *)
             (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems = uVar5;
            *(undefined8 *)
             ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
                 uVar6;
            if (&this->m_redownload_chain_work != &pCVar3->nChainWork) {
              lVar13 = 0;
              do {
                (this->m_redownload_chain_work).super_base_uint<256U>.pn[lVar13] =
                     (pCVar3->nChainWork).super_base_uint<256U>.pn[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 != 8);
            }
            this->m_download_state = REDOWNLOAD;
            pLVar12 = LogInstance();
            fmt = (char *)0x468c9d;
            bVar10 = BCLog::Logger::WillLogCategoryLevel(pLVar12,NET,Debug);
            if (bVar10) {
              logging_function_00._M_str = "ValidateAndStoreHeadersCommitments";
              logging_function_00._M_len = 0x22;
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
              ;
              source_file_00._M_len = 0x58;
              LogPrintf_<long,long,long>
                        (logging_function_00,source_file_00,iVar8 + 8,
                         (LogFlags)&this->m_current_height,iVar8 + 0x178,fmt,
                         in_stack_ffffffffffffffa8,
                         (long *)CONCAT17(in_stack_ffffffffffffffb7,
                                          CONCAT16(in_stack_ffffffffffffffb6,
                                                   CONCAT15(in_stack_ffffffffffffffb5,
                                                            CONCAT14(in_stack_ffffffffffffffb4,
                                                                     CONCAT13(
                                                  in_stack_ffffffffffffffb3,
                                                  CONCAT12(in_stack_ffffffffffffffb2,
                                                           CONCAT11(in_stack_ffffffffffffffb1,
                                                                    in_stack_ffffffffffffffb0)))))))
                         ,(long *)CONCAT17(in_stack_ffffffffffffffbf,
                                           CONCAT16(in_stack_ffffffffffffffbe,
                                                    CONCAT15(in_stack_ffffffffffffffbd,
                                                             CONCAT14(in_stack_ffffffffffffffbc,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffffbb,
                                                  CONCAT12(in_stack_ffffffffffffffba,
                                                           CONCAT11(in_stack_ffffffffffffffb9,
                                                                    in_stack_ffffffffffffffb8)))))))
                        );
            }
            goto LAB_00468aec;
          }
        }
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      goto LAB_00468aec;
    }
    pLVar12 = LogInstance();
    bVar9 = BCLog::Logger::WillLogCategoryLevel(pLVar12,NET,Debug);
    if (bVar9) {
      logging_function._M_str = "ValidateAndStoreHeadersCommitments";
      logging_function._M_len = 0x22;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
      ;
      source_file._M_len = 0x58;
      LogPrintf_<long,long>
                (logging_function,source_file,0x9a,IPC|COINDB|CMPCTBLOCK|ESTIMATEFEE|MEMPOOL|TOR|NET
                 ,iVar8 + 8,(char *)&this->m_current_height,in_stack_ffffffffffffffa8,
                 (long *)CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT15(in_stack_ffffffffffffffb5,
                                                    CONCAT14(in_stack_ffffffffffffffb4,
                                                             CONCAT13(in_stack_ffffffffffffffb3,
                                                                      CONCAT12(
                                                  in_stack_ffffffffffffffb2,
                                                  CONCAT11(in_stack_ffffffffffffffb1,
                                                           in_stack_ffffffffffffffb0))))))));
    }
  }
LAB_00468aea:
  bVar9 = false;
LAB_00468aec:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar9;
  }
  __stack_chk_fail();
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}